

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::sortByRole(tst_GenericModel *this)

{
  char cVar1;
  int iVar2;
  QModelIndex *pQVar3;
  anon_union_24_3_e3d07ef4_for_data local_1e0;
  GenericModel testModel;
  QPersistentModelIndex fiveIndex;
  anon_union_24_3_e3d07ef4_for_data local_190;
  QPersistentModelIndex oneIndex;
  int local_15c;
  ModelTest probe;
  QSignalSpy layoutChangedSpy;
  QSignalSpy layoutAboutToBeChangedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  GenericModel::setSortRole((int)&testModel);
  QSignalSpy::QSignalSpy
            (&layoutAboutToBeChangedSpy,(QObject *)&testModel,"2layoutAboutToBeChanged()");
  cVar1 = QTest::qVerify(layoutAboutToBeChangedSpy.sig.d.size != 0,
                         "layoutAboutToBeChangedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x4a8);
  if (cVar1 != '\0') {
    QSignalSpy::QSignalSpy(&layoutChangedSpy,(QObject *)&testModel,"2layoutChanged()");
    cVar1 = QTest::qVerify(layoutChangedSpy.sig.d.size != 0,"layoutChangedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x4aa);
    if (cVar1 != '\0') {
      local_1e0._forAlignment = -NAN;
      local_1e0._8_8_ = 0;
      local_1e0._16_8_ = 0;
      (**(code **)(_testModel + 0x100))(&testModel,0,1);
      local_1e0._forAlignment = -NAN;
      local_1e0._8_8_ = 0;
      local_1e0._16_8_ = 0;
      GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x5);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x0);
      QVariant::QVariant((QVariant *)&local_1e0,3);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x1);
      QVariant::QVariant((QVariant *)&local_1e0,1);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x2);
      QVariant::QVariant((QVariant *)&local_1e0,4);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x3);
      QVariant::QVariant((QVariant *)&local_1e0,2);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x4);
      QVariant::QVariant((QVariant *)&local_1e0,5);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x0);
      _oneIndex = (Data *)0x0;
      _fiveIndex = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_1e0,(QString *)&oneIndex);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oneIndex);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fiveIndex);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x1);
      _oneIndex = (Data *)0x0;
      _fiveIndex = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_1e0,(QString *)&oneIndex);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oneIndex);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fiveIndex);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x2);
      _oneIndex = (Data *)0x0;
      _fiveIndex = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_1e0,(QString *)&oneIndex);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oneIndex);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fiveIndex);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x3);
      _oneIndex = (Data *)0x0;
      _fiveIndex = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_1e0,(QString *)&oneIndex);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oneIndex);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fiveIndex);
      GenericModel::index((int)&local_190,(int)&testModel,(QModelIndex *)0x4);
      _oneIndex = (Data *)0x0;
      _fiveIndex = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_1e0,(QString *)&oneIndex);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_190,(int)&local_1e0);
      QVariant::~QVariant((QVariant *)&local_1e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oneIndex);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fiveIndex);
      local_190._forAlignment = -NAN;
      local_190._8_8_ = 0;
      local_190._16_8_ = 0;
      GenericModel::index((int)&local_1e0,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneIndex,(QModelIndex *)&local_1e0);
      local_190._forAlignment = -NAN;
      local_190._8_8_ = 0;
      local_190._16_8_ = 0;
      GenericModel::index((int)&local_1e0,(int)&testModel,(QModelIndex *)0x4);
      QPersistentModelIndex::QPersistentModelIndex(&fiveIndex,(QModelIndex *)&local_1e0);
      QPersistentModelIndex::data((int)&local_1e0);
      iVar2 = QVariant::toInt((bool *)local_1e0.data);
      cVar1 = QTest::qCompare(iVar2,1,"oneIndex.data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x4ba);
      QVariant::~QVariant((QVariant *)&local_1e0);
      if (cVar1 != '\0') {
        QPersistentModelIndex::data((int)&local_1e0);
        iVar2 = QVariant::toInt((bool *)local_1e0.data);
        cVar1 = QTest::qCompare(iVar2,5,"fiveIndex.data().toInt()","5",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x4bb);
        QVariant::~QVariant((QVariant *)&local_1e0);
        if (cVar1 != '\0') {
          GenericModel::sort((int)&testModel,AscendingOrder);
          cVar1 = QTest::qCompare(layoutAboutToBeChangedSpy.super_QList<QList<QVariant>_>.d.size,1,
                                  "layoutAboutToBeChangedSpy.count()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x4be);
          if ((cVar1 != '\0') &&
             (cVar1 = QTest::qCompare(layoutChangedSpy.super_QList<QList<QVariant>_>.d.size,1,
                                      "layoutChangedSpy.count()","1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x4bf), cVar1 != '\0')) {
            pQVar3 = (QModelIndex *)0x0;
            local_15c = 5;
            do {
              if (local_15c == 0) {
                QPersistentModelIndex::data((int)&local_1e0);
                iVar2 = QVariant::toInt((bool *)local_1e0.data);
                cVar1 = QTest::qCompare(iVar2,1,"oneIndex.data().toInt()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x4c2);
                QVariant::~QVariant((QVariant *)&local_1e0);
                if (cVar1 != '\0') {
                  QPersistentModelIndex::data((int)&local_1e0);
                  iVar2 = QVariant::toInt((bool *)local_1e0.data);
                  cVar1 = QTest::qCompare(iVar2,5,"fiveIndex.data().toInt()","5",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x4c3);
                  QVariant::~QVariant((QVariant *)&local_1e0);
                  if (cVar1 != '\0') {
                    iVar2 = QPersistentModelIndex::row();
                    cVar1 = QTest::qCompare(iVar2,4,"oneIndex.row()","4",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x4c4);
                    if (cVar1 != '\0') {
                      iVar2 = QPersistentModelIndex::row();
                      QTest::qCompare(iVar2,0,"fiveIndex.row()","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x4c5);
                    }
                  }
                }
                break;
              }
              GenericModel::index((int)&local_190,(int)&testModel,pQVar3);
              GenericModel::data((QModelIndex *)&local_1e0,(int)&testModel);
              iVar2 = QVariant::toInt((bool *)local_1e0.data);
              cVar1 = QTest::qCompare(iVar2,local_15c,
                                      "testModel.data(testModel.index(i, 0)).toInt()","5 - i",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x4c1);
              QVariant::~QVariant((QVariant *)&local_1e0);
              pQVar3 = (QModelIndex *)(ulong)((int)pQVar3 + 1);
              local_15c = local_15c + -1;
            } while (cVar1 != '\0');
          }
        }
      }
      QPersistentModelIndex::~QPersistentModelIndex(&fiveIndex);
      QPersistentModelIndex::~QPersistentModelIndex(&oneIndex);
    }
    QSignalSpy::~QSignalSpy(&layoutChangedSpy);
  }
  QSignalSpy::~QSignalSpy(&layoutAboutToBeChangedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::sortByRole()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.setSortRole(Qt::UserRole);
    QSignalSpy layoutAboutToBeChangedSpy(&testModel, SIGNAL(layoutAboutToBeChanged()));
    QVERIFY(layoutAboutToBeChangedSpy.isValid());
    QSignalSpy layoutChangedSpy(&testModel, SIGNAL(layoutChanged()));
    QVERIFY(layoutChangedSpy.isValid());

    testModel.insertColumn(0);
    testModel.insertRows(0, 5);
    testModel.setData(testModel.index(0, 0), 3);
    testModel.setData(testModel.index(1, 0), 1);
    testModel.setData(testModel.index(2, 0), 4);
    testModel.setData(testModel.index(3, 0), 2);
    testModel.setData(testModel.index(4, 0), 5);
    testModel.setData(testModel.index(0, 0), QStringLiteral("Charles"), Qt::UserRole);
    testModel.setData(testModel.index(1, 0), QStringLiteral("Emma"), Qt::UserRole);
    testModel.setData(testModel.index(2, 0), QStringLiteral("Bob"), Qt::UserRole);
    testModel.setData(testModel.index(3, 0), QStringLiteral("Daniel"), Qt::UserRole);
    testModel.setData(testModel.index(4, 0), QStringLiteral("Alice"), Qt::UserRole);
    QPersistentModelIndex oneIndex(testModel.index(1, 0));
    QPersistentModelIndex fiveIndex(testModel.index(4, 0));
    QCOMPARE(oneIndex.data().toInt(), 1);
    QCOMPARE(fiveIndex.data().toInt(), 5);

    testModel.sort(0, Qt::AscendingOrder);
    QCOMPARE(layoutAboutToBeChangedSpy.count(), 1);
    QCOMPARE(layoutChangedSpy.count(), 1);
    for (int i = 0; i < 5; ++i)
        QCOMPARE(testModel.data(testModel.index(i, 0)).toInt(), 5 - i);
    QCOMPARE(oneIndex.data().toInt(), 1);
    QCOMPARE(fiveIndex.data().toInt(), 5);
    QCOMPARE(oneIndex.row(), 4);
    QCOMPARE(fiveIndex.row(), 0);
}